

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_expression.hpp
# Opt level: O2

void __thiscall duckdb::ParameterExpression::ParameterExpression(ParameterExpression *this)

{
  (this->super_ParsedExpression).super_BaseExpression.type = VALUE_PARAMETER;
  (this->super_ParsedExpression).super_BaseExpression.expression_class = PARAMETER;
  (this->super_ParsedExpression).super_BaseExpression.alias._M_dataplus._M_p =
       (pointer)&(this->super_ParsedExpression).super_BaseExpression.alias.field_2;
  (this->super_ParsedExpression).super_BaseExpression.alias._M_string_length = 0;
  (this->super_ParsedExpression).super_BaseExpression.alias.field_2._M_local_buf[0] = '\0';
  (this->super_ParsedExpression).super_BaseExpression.query_location.index = 0xffffffffffffffff;
  (this->super_ParsedExpression).super_BaseExpression._vptr_BaseExpression =
       (_func_int **)&PTR__ParameterExpression_02791d40;
  (this->identifier)._M_dataplus._M_p = (pointer)&(this->identifier).field_2;
  (this->identifier)._M_string_length = 0;
  (this->identifier).field_2._M_local_buf[0] = '\0';
  return;
}

Assistant:

BaseExpression(ExpressionType type, ExpressionClass expression_class)
	    : type(type), expression_class(expression_class) {
	}